

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::declare_undefined_values(CompilerMSL *this)

{
  uint id;
  size_t sVar1;
  bool bVar2;
  SPIRUndef *pSVar3;
  SPIRType *pSVar4;
  long lVar5;
  LoopLock local_88;
  ParsedIR *local_80;
  TypedID<(spirv_cross::Types)0> *local_78;
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_80 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(local_80);
  local_78 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[0xc].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[0xc].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  bVar2 = false;
  for (lVar5 = 0; sVar1 << 2 != lVar5; lVar5 = lVar5 + 4) {
    id = *(uint *)((long)&local_78->id + lVar5);
    if ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.ptr
        [id].type == TypeUndef) {
      pSVar3 = ParsedIR::get<spirv_cross::SPIRUndef>(local_80,id);
      pSVar4 = Compiler::get<spirv_cross::SPIRType>
                         ((Compiler *)this,*(uint32_t *)&(pSVar3->super_IVariant).field_0xc);
      if (*(int *)&(pSVar4->super_IVariant).field_0xc != 1) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (local_70,this,(ulong)(pSVar3->super_IVariant).self.id,1);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1a])
                  (&local_50,this,pSVar4,local_70,(ulong)(pSVar3->super_IVariant).self.id);
        CompilerGLSL::statement<char_const(&)[10],std::__cxx11::string,char_const(&)[7]>
                  (&this->super_CompilerGLSL,(char (*) [10])"constant ",&local_50,
                   (char (*) [7])" = {};");
        ::std::__cxx11::string::~string((string *)&local_50);
        ::std::__cxx11::string::~string(local_70);
        bVar2 = true;
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock(&local_88);
  if (bVar2) {
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x303078);
  }
  return;
}

Assistant:

void CompilerMSL::declare_undefined_values()
{
	bool emitted = false;
	ir.for_each_typed_id<SPIRUndef>([&](uint32_t, SPIRUndef &undef) {
		auto &type = this->get<SPIRType>(undef.basetype);
		// OpUndef can be void for some reason ...
		if (type.basetype == SPIRType::Void)
			return;

		statement("constant ", variable_decl(type, to_name(undef.self), undef.self), " = {};");
		emitted = true;
	});

	if (emitted)
		statement("");
}